

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGL3DriverBase::setClipPlane
          (COpenGL3DriverBase *this,u32 index,plane3df *plane,bool enable)

{
  undefined8 uVar1;
  u32 uVar2;
  SUserClipPlane *pSVar3;
  byte in_CL;
  undefined8 *in_RDX;
  uint in_ESI;
  SUserClipPlane *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 local_30 [23];
  byte local_19;
  undefined8 *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  uVar2 = core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::size
                    ((array<irr::video::COpenGL3DriverBase::SUserClipPlane> *)0x363dd8);
  if (uVar2 <= in_ESI) {
    memset(local_30,0,0x14);
    SUserClipPlane::SUserClipPlane((SUserClipPlane *)0x363e0d);
    core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::push_back
              ((array<irr::video::COpenGL3DriverBase::SUserClipPlane> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  pSVar3 = core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::operator[]
                     ((array<irr::video::COpenGL3DriverBase::SUserClipPlane> *)
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      (u32)((ulong)local_18 >> 0x20));
  uVar1 = *local_18;
  (pSVar3->Plane).Normal.X = (float)(int)uVar1;
  (pSVar3->Plane).Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(pSVar3->Plane).Normal.Z = local_18[1];
  pSVar3 = core::array<irr::video::COpenGL3DriverBase::SUserClipPlane>::operator[]
                     ((array<irr::video::COpenGL3DriverBase::SUserClipPlane> *)
                      CONCAT17(local_19,in_stack_ffffffffffffffb0),(u32)((ulong)local_18 >> 0x20));
  pSVar3->Enabled = (bool)(local_19 & 1);
  return true;
}

Assistant:

bool COpenGL3DriverBase::setClipPlane(u32 index, const core::plane3df &plane, bool enable)
{
	if (index >= UserClipPlane.size())
		UserClipPlane.push_back(SUserClipPlane());

	UserClipPlane[index].Plane = plane;
	UserClipPlane[index].Enabled = enable;
	return true;
}